

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgnometheme.cpp
# Opt level: O3

QVariant * __thiscall
QGnomeTheme::themeHint(QVariant *__return_storage_ptr__,QGnomeTheme *this,ThemeHint hint)

{
  QSize QVar1;
  int iVar2;
  longlong lVar3;
  long in_FS_OFFSET;
  QArrayData *d;
  QString local_78;
  QString local_60;
  QArrayDataPointer<QString> local_48;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  switch(hint) {
  case SystemIconThemeName:
    local_48.d = (Data *)0x0;
    local_48.ptr = (QString *)0x6c8c32;
    local_48.size = 7;
    goto LAB_0062f7f9;
  case SystemIconFallbackThemeName:
    local_48.d = (Data *)0x0;
    local_48.ptr = (QString *)0x6c8c42;
    local_48.size = 5;
    goto LAB_0062f7f9;
  case IconThemeSearchPaths:
    QGenericUnixTheme::xdgIconThemePaths();
    goto LAB_0062f8ea;
  case StyleNames:
    local_48.d = (Data *)0x0;
    local_48.ptr = (QString *)0x0;
    local_48.size = 0;
    local_60.d.d = (Data *)0x0;
    local_60.d.ptr = L"Fusion";
    local_60.d.size = 6;
    QtPrivate::QMovableArrayOps<QString>::emplace<QString>
              ((QMovableArrayOps<QString> *)&local_48,0,&local_60);
    QList<QString>::end((QList<QString> *)&local_48);
    local_78.d.d = (Data *)0x0;
    local_78.d.ptr = L"windows";
    local_78.d.size = 7;
    QtPrivate::QMovableArrayOps<QString>::emplace<QString>
              ((QMovableArrayOps<QString> *)&local_48,local_48.size,&local_78);
    QList<QString>::end((QList<QString> *)&local_48);
    if (&(local_78.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_78.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_78.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_78.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_78.d.d)->super_QArrayData,2,0x10);
      }
    }
    if (&(local_60.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_60.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_60.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_60.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_60.d.d)->super_QArrayData,2,0x10);
      }
    }
LAB_0062f8ea:
    ::QVariant::QVariant(__return_storage_ptr__,(QList_conflict *)&local_48);
    QArrayDataPointer<QString>::~QArrayDataPointer(&local_48);
    goto LAB_0062f8fd;
  default:
    if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
      QPlatformTheme::themeHint(__return_storage_ptr__,(QPlatformTheme *)this,hint);
      return __return_storage_ptr__;
    }
    break;
  case DialogButtonBoxLayout:
    if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
      iVar2 = 3;
LAB_0062f980:
      ::QVariant::QVariant(__return_storage_ptr__,iVar2);
      return __return_storage_ptr__;
    }
    break;
  case DialogButtonBoxButtonsHaveIcons:
  case PreselectFirstFileInDirectory:
  case PreferFileIconFromTheme:
    if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
      ::QVariant::QVariant(__return_storage_ptr__,true);
      return __return_storage_ptr__;
    }
    break;
  case KeyboardScheme:
    if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
      iVar2 = 4;
      goto LAB_0062f980;
    }
    break;
  case UiEffects:
    if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
      iVar2 = 0x80;
      goto LAB_0062f980;
    }
    break;
  case IconPixmapSizes:
    QGenericUnixTheme::availableXdgFileIconSizes();
    if ((__atomic_base<int>)
        QtPrivate::QMetaTypeInterfaceWrapper<QList<QSize>_>::metaType.typeId._q_value.
        super___atomic_base<int>._M_i == (__atomic_base<int>)0x0) {
      QMetaType::registerHelper(&QtPrivate::QMetaTypeInterfaceWrapper<QList<QSize>_>::metaType);
    }
    ::QVariant::moveConstruct
              ((QMetaType)__return_storage_ptr__,
               &QtPrivate::QMetaTypeInterfaceWrapper<QList<QSize>_>::metaType);
    if (&(local_48.d)->super_QArrayData == (QArrayData *)0x0) goto LAB_0062f8fd;
    LOCK();
    ((local_48.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_48.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_48.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i != 0)
    goto LAB_0062f8fd;
    lVar3 = 8;
    goto LAB_0062f823;
  case PasswordMaskCharacter:
    if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
      ::QVariant::QVariant(__return_storage_ptr__,(QChar)0x2022);
      return __return_storage_ptr__;
    }
    break;
  case ButtonPressKeys:
    local_48.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
    local_48.ptr = (QString *)QArrayData::allocate((QArrayData **)&local_48,4,0x10,4,KeepSize);
    ((local_48.ptr)->d).d = (Data *)0x100000400000020;
    ((local_48.ptr)->d).ptr = (char16_t *)0x101000001000005;
    local_48.size = 4;
    if ((__atomic_base<int>)
        QtPrivate::QMetaTypeInterfaceWrapper<QList<Qt::Key>_>::metaType.typeId._q_value.
        super___atomic_base<int>._M_i == (__atomic_base<int>)0x0) {
      QMetaType::registerHelper(&QtPrivate::QMetaTypeInterfaceWrapper<QList<Qt::Key>_>::metaType);
    }
    ::QVariant::moveConstruct
              ((QMetaType)__return_storage_ptr__,
               &QtPrivate::QMetaTypeInterfaceWrapper<QList<Qt::Key>_>::metaType);
    if (&(local_48.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_48.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_48.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_48.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        lVar3 = 4;
        goto LAB_0062f823;
      }
    }
    goto LAB_0062f8fd;
  case MouseCursorTheme:
    QGenericUnixTheme::mouseCursorTheme();
LAB_0062f7f9:
    ::QVariant::QVariant(__return_storage_ptr__,(QString *)&local_48);
    if (&(local_48.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_48.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_48.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_48.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        lVar3 = 2;
LAB_0062f823:
        QArrayData::deallocate(&(local_48.d)->super_QArrayData,lVar3,0x10);
      }
    }
LAB_0062f8fd:
    if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
      return __return_storage_ptr__;
    }
    break;
  case MouseCursorSize:
    QVar1 = QGenericUnixTheme::mouseCursorSize();
    if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
      ::QVariant::QVariant(__return_storage_ptr__,QVar1);
      return __return_storage_ptr__;
    }
  }
  __stack_chk_fail();
}

Assistant:

QVariant QGnomeTheme::themeHint(QPlatformTheme::ThemeHint hint) const
{
    switch (hint) {
    case QPlatformTheme::DialogButtonBoxButtonsHaveIcons:
        return QVariant(true);
    case QPlatformTheme::DialogButtonBoxLayout:
        return QVariant(QPlatformDialogHelper::GnomeLayout);
    case QPlatformTheme::SystemIconThemeName:
        return QVariant(QStringLiteral("Adwaita"));
    case QPlatformTheme::SystemIconFallbackThemeName:
        return QVariant(QStringLiteral("gnome"));
    case QPlatformTheme::IconThemeSearchPaths:
        return QVariant(xdgIconThemePaths());
    case QPlatformTheme::IconPixmapSizes:
        return QVariant::fromValue(availableXdgFileIconSizes());
    case QPlatformTheme::StyleNames: {
        QStringList styleNames;
        styleNames << QStringLiteral("Fusion") << QStringLiteral("windows");
        return QVariant(styleNames);
    }
    case QPlatformTheme::KeyboardScheme:
        return QVariant(int(GnomeKeyboardScheme));
    case QPlatformTheme::PasswordMaskCharacter:
        return QVariant(QChar(0x2022));
    case QPlatformTheme::UiEffects:
        return QVariant(int(HoverEffect));
    case QPlatformTheme::ButtonPressKeys:
        return QVariant::fromValue(
                QList<Qt::Key>({ Qt::Key_Space, Qt::Key_Return, Qt::Key_Enter, Qt::Key_Select }));
    case QPlatformTheme::PreselectFirstFileInDirectory:
        return true;
    case QPlatformTheme::MouseCursorTheme:
        return QVariant(mouseCursorTheme());
    case QPlatformTheme::MouseCursorSize:
        return QVariant(mouseCursorSize());
    case QPlatformTheme::PreferFileIconFromTheme:
        return true;
    default:
        break;
    }
    return QPlatformTheme::themeHint(hint);
}